

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

int SearchVocab(char *word)

{
  int iVar1;
  vocab_word *pvVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = GetWordHash(word);
  piVar3 = vocab_hash;
  pvVar2 = vocab;
  while( true ) {
    iVar1 = piVar3[uVar4];
    if (((long)iVar1 == -1) || (iVar5 = strcmp(word,pvVar2[iVar1].word), iVar5 == 0)) break;
    uVar4 = uVar4 + 1;
    if (uVar4 == 30000000) {
      uVar4 = 0;
    }
  }
  return iVar1;
}

Assistant:

int SearchVocab(char *word) {
  unsigned int hash = GetWordHash(word);
  while (1) {
    if (vocab_hash[hash] == -1) return -1;
    if (!strcmp(word, vocab[vocab_hash[hash]].word)) return vocab_hash[hash];
    hash = (hash + 1) % vocab_hash_size;
  }
  return -1;
}